

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Control.cpp
# Opt level: O3

void __thiscall Control::loop(undefined8 param_1,GameData *Data,int param_3)

{
  pointer pcVar1;
  bool flagGameOver;
  int ope;
  long lVar2;
  GameData *pGVar3;
  undefined8 *puVar4;
  bool flagQuit;
  byte bVar5;
  Draw local_ad;
  GameOperator local_ac;
  undefined1 local_a8 [80];
  _Alloc_hider local_58;
  char local_48 [16];
  int local_38;
  
  bVar5 = 0;
  local_ac.statusNum = param_3;
  GameData::InitNewGame(Data);
  flagGameOver = false;
  flagQuit = false;
  do {
    pGVar3 = Data;
    puVar4 = (undefined8 *)local_a8;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *(undefined8 *)pGVar3;
      pGVar3 = (GameData *)((long)pGVar3 + (ulong)bVar5 * -0x10 + 8);
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    local_a8._72_4_ = Data->my_best;
    pcVar1 = (Data->local_name)._M_dataplus._M_p;
    local_58._M_p = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + (Data->local_name)._M_string_length);
    local_38 = Data->local_best;
    Draw::PrintUi(&local_ad,(GameData *)local_a8,flagQuit,flagGameOver);
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    ope = GameOperator::GetMoveNumber(&local_ac);
    if (flagGameOver == false) {
      if (flagQuit) {
        while (ope - 8U < 0xfffffffe) {
          ope = GameOperator::GetMoveNumber(&local_ac);
        }
        if (ope == 6) {
          return;
        }
        flagGameOver = false;
        flagQuit = false;
      }
      else {
        flagQuit = ope == 5;
        if (0xfffffffc < ope - 8U) goto LAB_001025af;
        GameOperator::Move(&local_ac,Data,ope);
        flagGameOver = GameData::IsGameOver(Data);
        if (Data->IsMove == true) {
          GameData::MakeNewNumber(Data);
        }
      }
    }
    else {
      while (ope - 8U < 0xfffffffe) {
        ope = GameOperator::GetMoveNumber(&local_ac);
      }
      if (ope != 6) {
        return;
      }
      GameData::InitNewGame(Data);
LAB_001025af:
      flagGameOver = false;
    }
    Draw::ClearScreen(&local_ad);
  } while( true );
}

Assistant:

void Control::loop(GameData Data, Draw DrawUi, GameOperator Operator) {
    bool flagQuit = false;
    bool flagGameOver = false;
    Data.InitNewGame();
    while (true) {
        DrawUi.PrintUi(Data, flagQuit, flagGameOver);

        int Tempop;
        if (flagGameOver) {
            Tempop = Operator.GetMoveNumber();
            while (Tempop != YES && Tempop != NO)
                Tempop = Operator.GetMoveNumber();
            if (Tempop == YES) {
                Data.InitNewGame();
                flagGameOver = false;
            } else
                break;
        }

        else if (flagQuit) {
            Tempop = Operator.GetMoveNumber();
            while (Tempop != YES && Tempop != NO)
                Tempop = Operator.GetMoveNumber();
            if (Tempop == YES)
                break;
            else
                flagQuit = false;
        }

        else
        {
            Tempop = Operator.GetMoveNumber();

            if (Tempop == QUIT)
                flagQuit = true;

            if (Tempop != NO && Tempop != YES && Tempop != QUIT) {
                Operator.Move(Data, Tempop);
                if (Data.IsGameOver())
                    flagGameOver = true;
                if(Data.IsMove)
                    Data.MakeNewNumber();
            }
        }

        DrawUi.ClearScreen();
    }
}